

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void zerohyp_clrm(int N,double *b,double *val,double *tval,double *pval)

{
  double dVar1;
  double dVar2;
  
  dVar2 = *b;
  dVar1 = val[1];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  *tval = ABS(dVar2) / dVar1;
  dVar2 = b[1];
  dVar1 = val[2];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  tval[1] = ABS(dVar2) / dVar1;
  dVar2 = tcdf(ABS(*tval),N + -2);
  *pval = 1.0 - dVar2;
  dVar2 = tcdf(ABS(tval[1]),N + -2);
  pval[1] = 1.0 - dVar2;
  return;
}

Assistant:

void zerohyp_clrm(int N, double *b, double *val, double *tval, double *pval) {
	int df;
	/*
	* Zero Hypothesis Test for CLRM
	*/

	df = N - 2;

	tval[0] = fabs(b[0]) / sqrt(val[1]);
	tval[1] = fabs(b[1]) / sqrt(val[2]);

	pval[0] = 1.0 - tcdf(fabs(tval[0]), df);
	pval[1] = 1.0 - tcdf(fabs(tval[1]), df);
}